

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

int32_t adt_hash_keys(adt_hash_t *self,adt_ary_t *pArray)

{
  char *pcVar1;
  int32_t s32Len;
  char *pElem;
  int local_2c;
  char *pcStack_28;
  int32_t s32i;
  char *pKey;
  adt_ary_t *pArray_local;
  adt_hash_t *self_local;
  
  local_2c = 0;
  if ((self == (adt_hash_t *)0x0) || (pArray == (adt_ary_t *)0x0)) {
    self_local._4_4_ = 0;
  }
  else {
    pKey = (char *)pArray;
    pArray_local = (adt_ary_t *)self;
    adt_hash_iter_init(self);
    adt_ary_clear((adt_ary_t *)pKey);
    pcVar1 = pKey;
    s32Len = adt_hash_length((adt_hash_t *)pArray_local);
    adt_ary_extend((adt_ary_t *)pcVar1,s32Len);
    do {
      adt_hash_iter_next((adt_hash_t *)pArray_local,&stack0xffffffffffffffd8);
      pcVar1 = pKey;
      if (pcStack_28 != (char *)0x0) {
        pElem = strdup(pcStack_28);
        adt_ary_set((adt_ary_t *)pcVar1,local_2c,pElem);
        local_2c = local_2c + 1;
      }
    } while (pcStack_28 != (char *)0x0);
    self_local._4_4_ = local_2c;
  }
  return self_local._4_4_;
}

Assistant:

int32_t adt_hash_keys(adt_hash_t *self,adt_ary_t *pArray){
	const char *pKey;
	int32_t s32i=0;

	if( (self==0) || (pArray==0)) return 0;

   adt_hash_iter_init(self);
   adt_ary_clear(pArray);
   adt_ary_extend(pArray, adt_hash_length(self));
   do{
      (void) adt_hash_iter_next(self,&pKey);
      if(pKey != 0){
         adt_ary_set(pArray,s32i++, STRDUP(pKey));
      }
   }while(pKey);

	return (uint32_t) s32i;
}